

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_base_assert_ok_nolock_(event_base *base)

{
  event **ppeVar1;
  event *peVar2;
  long lVar3;
  long lVar4;
  common_timeout_list *pcVar5;
  evcallback_list *peVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  event_callback *peVar10;
  ulong uVar11;
  ulong uVar12;
  event *peVar13;
  event *peVar14;
  event *peVar15;
  common_timeout_list *pcVar16;
  event_callback *peVar17;
  event_callback *peVar18;
  event_callback *peVar19;
  bool bVar20;
  bool bVar21;
  
  evmap_check_integrity_(base);
  uVar9 = (ulong)(int)(base->timeheap).n;
  if (1 < (long)uVar9) {
    ppeVar1 = (base->timeheap).p;
    uVar11 = 1;
    uVar12 = 0;
    do {
      peVar2 = ppeVar1[uVar11];
      if (((peVar2->ev_evcallback).evcb_flags & 1) == 0) goto LAB_002d0d6a;
      peVar15 = ppeVar1[uVar12 >> 1 & 0x7fffffff];
      lVar3 = (peVar2->ev_timeout).tv_sec;
      lVar4 = (peVar15->ev_timeout).tv_sec;
      bVar21 = SBORROW8(lVar4,lVar3);
      lVar7 = lVar4 - lVar3;
      bVar20 = lVar4 == lVar3;
      if (bVar20) {
        lVar3 = (peVar15->ev_timeout).tv_usec;
        lVar4 = (peVar2->ev_timeout).tv_usec;
        bVar21 = SBORROW8(lVar3,lVar4);
        lVar7 = lVar3 - lVar4;
        bVar20 = lVar3 == lVar4;
      }
      if (!bVar20 && bVar21 == lVar7 < 0) goto LAB_002d0d6f;
      if (uVar11 != (uint)(peVar2->ev_timeout_pos).min_heap_idx) goto LAB_002d0d74;
      uVar11 = uVar11 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar11);
  }
  iVar8 = base->n_common_timeouts;
  if (0 < (long)iVar8) {
    uVar9 = 0;
    do {
      pcVar5 = base->common_timeout_queues[uVar9];
      peVar2 = (pcVar5->events).tqh_first;
      peVar13 = peVar2;
      peVar15 = peVar2;
      if (peVar2 != (event *)0x0) {
        while ((peVar14 = peVar2, pcVar16 = pcVar5, peVar13 != (event *)0x0 &&
               (peVar15 = (peVar15->ev_timeout_pos).ev_next_with_common_timeout.tqe_next,
               peVar15 != (event *)0x0))) {
          if (peVar13 == peVar15) goto LAB_002d0d47;
          peVar15 = (peVar15->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
          if (peVar15 == (event *)0x0) break;
          peVar13 = (peVar13->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
          if (peVar13 == peVar15) goto LAB_002d0d4c;
        }
        do {
          if (pcVar16 !=
              (common_timeout_list *)(peVar14->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev)
          {
            event_base_assert_ok_nolock__cold_3();
            goto LAB_002d0d38;
          }
          peVar15 = (peVar14->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
          pcVar16 = (common_timeout_list *)&peVar14->ev_timeout_pos;
          peVar14 = peVar15;
        } while (peVar15 != (event *)0x0);
        if (pcVar16 != (common_timeout_list *)(pcVar5->events).tqh_last) goto LAB_002d0d7e;
        if (peVar2 != (event *)0x0) {
          peVar15 = (event *)0x0;
          do {
            peVar13 = peVar2;
            if (peVar15 != (event *)0x0) {
              lVar3 = (peVar13->ev_timeout).tv_sec;
              lVar4 = (peVar15->ev_timeout).tv_sec;
              bVar21 = SBORROW8(lVar4,lVar3);
              lVar7 = lVar4 - lVar3;
              bVar20 = lVar4 == lVar3;
              if (bVar20) {
                lVar3 = (peVar15->ev_timeout).tv_usec;
                lVar4 = (peVar13->ev_timeout).tv_usec;
                bVar21 = SBORROW8(lVar3,lVar4);
                lVar7 = lVar3 - lVar4;
                bVar20 = lVar3 == lVar4;
              }
              if (!bVar20 && bVar21 == lVar7 < 0) goto LAB_002d0d5b;
            }
            if (((peVar13->ev_evcallback).evcb_flags & 1) == 0) goto LAB_002d0d3d;
            uVar12 = (peVar13->ev_timeout).tv_usec;
            if ((((uint)uVar12 & 0xf0000000) != 0x50000000) ||
               (iVar8 <= (int)((uint)(uVar12 >> 0x14) & 0xff))) goto LAB_002d0d8d;
            if ((uVar12 >> 0x14 & 0xff) != uVar9) goto LAB_002d0d42;
            peVar2 = (peVar13->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
            peVar15 = peVar13;
          } while (peVar2 != (event *)0x0);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (long)iVar8);
  }
  if (0 < (long)base->nactivequeues) {
    peVar6 = base->activequeues;
    uVar9 = 0;
    iVar8 = 0;
LAB_002d0c72:
    peVar10 = peVar6[uVar9].tqh_first;
    if (peVar10 != (event_callback *)0x0) {
      peVar17 = (event_callback *)(peVar6 + uVar9);
      peVar18 = peVar10;
      peVar19 = peVar10;
      while ((peVar18 != (event_callback *)0x0 &&
             (peVar19 = (peVar19->evcb_active_next).tqe_next, peVar19 != (event_callback *)0x0))) {
        if (peVar18 == peVar19) goto LAB_002d0d60;
        peVar19 = (peVar19->evcb_active_next).tqe_next;
        if (peVar19 == (event_callback *)0x0) break;
        peVar18 = (peVar18->evcb_active_next).tqe_next;
        if (peVar18 == peVar19) goto LAB_002d0d65;
      }
      do {
        peVar19 = (peVar17->evcb_active_next).tqe_next;
        if (peVar19 == (event_callback *)0x0) goto code_r0x002d0cc8;
        bVar20 = peVar17 != (event_callback *)(peVar19->evcb_active_next).tqe_prev;
        peVar17 = peVar19;
        if (bVar20) goto LAB_002d0d38;
      } while( true );
    }
    goto LAB_002d0cf9;
  }
  iVar8 = 0;
LAB_002d0d09:
  for (peVar10 = (base->active_later_queue).tqh_first; peVar10 != (event_callback *)0x0;
      peVar10 = (peVar10->evcb_active_next).tqe_next) {
    if ((peVar10->evcb_flags & 0x28U) != 0x20) goto LAB_002d0d79;
    iVar8 = iVar8 + 1;
  }
  if (iVar8 == base->event_count_active) {
    return;
  }
LAB_002d0d88:
  event_base_assert_ok_nolock__cold_17();
LAB_002d0d8d:
  event_base_assert_ok_nolock__cold_6();
code_r0x002d0cc8:
  if (peVar17 != (event_callback *)peVar6[uVar9].tqh_last) goto LAB_002d0d83;
  for (; peVar10 != (event_callback *)0x0; peVar10 = (peVar10->evcb_active_next).tqe_next) {
    if ((peVar10->evcb_flags & 0x28U) != 8) goto LAB_002d0d51;
    if (uVar9 != peVar10->evcb_pri) goto LAB_002d0d56;
    iVar8 = iVar8 + 1;
  }
LAB_002d0cf9:
  uVar9 = uVar9 + 1;
  if (uVar9 == (long)base->nactivequeues) goto LAB_002d0d09;
  goto LAB_002d0c72;
LAB_002d0d38:
  event_base_assert_ok_nolock__cold_11();
LAB_002d0d3d:
  event_base_assert_ok_nolock__cold_8();
LAB_002d0d42:
  event_base_assert_ok_nolock__cold_7();
LAB_002d0d47:
  event_base_assert_ok_nolock__cold_9();
LAB_002d0d4c:
  event_base_assert_ok_nolock__cold_2();
LAB_002d0d51:
  event_base_assert_ok_nolock__cold_13();
LAB_002d0d56:
  event_base_assert_ok_nolock__cold_14();
LAB_002d0d5b:
  event_base_assert_ok_nolock__cold_5();
LAB_002d0d60:
  event_base_assert_ok_nolock__cold_15();
LAB_002d0d65:
  event_base_assert_ok_nolock__cold_10();
LAB_002d0d6a:
  event_base_assert_ok_nolock__cold_19();
LAB_002d0d6f:
  event_base_assert_ok_nolock__cold_18();
LAB_002d0d74:
  event_base_assert_ok_nolock__cold_1();
LAB_002d0d79:
  event_base_assert_ok_nolock__cold_16();
LAB_002d0d7e:
  event_base_assert_ok_nolock__cold_4();
LAB_002d0d83:
  event_base_assert_ok_nolock__cold_12();
  goto LAB_002d0d88;
}

Assistant:

void
event_base_assert_ok_nolock_(struct event_base *base)
{
	int i;
	int count;

	/* First do checks on the per-fd and per-signal lists */
	evmap_check_integrity_(base);

	/* Check the heap property */
	for (i = 1; i < (int)base->timeheap.n; ++i) {
		int parent = (i - 1) / 2;
		struct event *ev, *p_ev;
		ev = base->timeheap.p[i];
		p_ev = base->timeheap.p[parent];
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
		EVUTIL_ASSERT(evutil_timercmp(&p_ev->ev_timeout, &ev->ev_timeout, <=));
		EVUTIL_ASSERT(ev->ev_timeout_pos.min_heap_idx == i);
	}

	/* Check that the common timeouts are fine */
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl = base->common_timeout_queues[i];
		struct event *last=NULL, *ev;

		EVUTIL_ASSERT_TAILQ_OK(&ctl->events, event, ev_timeout_pos.ev_next_with_common_timeout);

		TAILQ_FOREACH(ev, &ctl->events, ev_timeout_pos.ev_next_with_common_timeout) {
			if (last)
				EVUTIL_ASSERT(evutil_timercmp(&last->ev_timeout, &ev->ev_timeout, <=));
			EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
			EVUTIL_ASSERT(is_common_timeout(&ev->ev_timeout,base));
			EVUTIL_ASSERT(COMMON_TIMEOUT_IDX(&ev->ev_timeout) == i);
			last = ev;
		}
	}

	/* Check the active queues. */
	count = 0;
	for (i = 0; i < base->nactivequeues; ++i) {
		struct event_callback *evcb;
		EVUTIL_ASSERT_TAILQ_OK(&base->activequeues[i], event_callback, evcb_active_next);
		TAILQ_FOREACH(evcb, &base->activequeues[i], evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE);
			EVUTIL_ASSERT(evcb->evcb_pri == i);
			++count;
		}
	}

	{
		struct event_callback *evcb;
		TAILQ_FOREACH(evcb, &base->active_later_queue, evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE_LATER);
			++count;
		}
	}
	EVUTIL_ASSERT(count == base->event_count_active);
}